

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O2

vector<unsigned_short> * __thiscall
lzham::vector<unsigned_short>::operator=(vector<unsigned_short> *this,vector<unsigned_short> *other)

{
  bool bVar1;
  
  if (this != other) {
    if (this->m_capacity < other->m_size) {
      clear(this);
      bVar1 = increase_capacity(this,other->m_size,false,false);
      if (!bVar1) {
        lzham_fail("\"lzham::vector operator=: Out of memory!\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/decomp/lzham_vector.h"
                   ,0x60);
        return this;
      }
    }
    else {
      try_resize(this,0,false);
    }
    memcpy(this->m_p,other->m_p,(ulong)other->m_size * 2);
    this->m_size = other->m_size;
  }
  return this;
}

Assistant:

inline vector& operator= (const vector& other)
      {
         if (this == &other)
            return *this;

         if (m_capacity >= other.m_size)
            try_resize(0);
         else
         {
            clear();
            if (!increase_capacity(other.m_size, false))
            {
               LZHAM_FAIL("lzham::vector operator=: Out of memory!");
               return *this;
            }
         }

         if (LZHAM_IS_BITWISE_COPYABLE(T))
            memcpy(m_p, other.m_p, other.m_size * sizeof(T));
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint i = other.m_size; i > 0; i--)
               helpers::construct(pDst++, *pSrc++);
         }

         m_size = other.m_size;

         return *this;
      }